

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O3

vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
::scc(vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      *__return_storage_ptr__,
     Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
     *this)

{
  pointer *ppvVar1;
  iterator __position;
  pointer ppNVar2;
  _Hash_node_base *p_Var3;
  vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
  *__range4;
  pointer ppNVar4;
  __normal_iterator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_**,_std::vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>_>
  __tmp;
  pointer ppNVar5;
  Container *__range2;
  vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
  reversed_topological_order;
  vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
  local_78;
  vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
  local_60;
  vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
  local_48;
  
  dual_dfs(&local_48,this);
  if (local_48.
      super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dual_dfs(&local_60,this);
  ppNVar4 = local_60.
            super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_60.
      super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_60.
      super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      ppNVar5 = local_60.
                super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (local_60.
          super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->visited == false) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::_M_realloc_insert<>(__return_storage_ptr__,__position);
        }
        else {
          ((__position._M_current)->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppvVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
        local_78.
        super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Node::primal_dfs(*ppNVar5,&local_78);
        ppNVar2 = local_78.
                  super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppNVar4 = local_78.
                       super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppNVar4 != ppNVar2;
            ppNVar4 = ppNVar4 + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((__return_storage_ptr__->
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish + -1,&(*ppNVar4)->name);
        }
        ppNVar4 = local_60.
                  super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_78.
            super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          ppNVar4 = local_60.
                    super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      local_60.
      super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppNVar5;
    } while (ppNVar5 != ppNVar4);
  }
  for (p_Var3 = (this->nodes)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    *(undefined1 *)&p_Var3[0xf]._M_nxt = 0;
  }
  if (ppNVar4 != (pointer)0x0) {
    operator_delete(ppNVar4,(long)local_60.
                                  super__Vector_base<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar4
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Index>> scc() {
        dual_dfs();
        std::vector<std::vector<Index>> result;
        auto reversed_topological_order = dual_dfs();
        for (auto i = reversed_topological_order.rbegin(); i != reversed_topological_order.rend(); ++i) {
            if (!(*i)->visited) {
                result.emplace_back();
                std::vector<const Node *> subgraph{};
                (*i)->primal_dfs(subgraph);
                for (auto j: subgraph) {
                    result.back().push_back(j->name);
                }
            }
        }
        for (auto &i: nodes) {
            TypeImpl::get(i).visited = false;
        }
        return result;
    }